

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

void Saig_Bmc3ManStop(Gia_ManBmc_t *p)

{
  Vec_Wec_t *__ptr;
  void *pvVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Hsh_IntMan_t *__ptr_00;
  Vec_Wrd_t *__ptr_01;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int level;
  bmcg_sat_solver *s;
  satoko_t *s_00;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint local_3c;
  sat_solver *psVar8;
  
  if (p->pPars->fVerbose != 0) {
    psVar8 = p->pSat;
    uVar9 = 0;
    uVar7 = 0;
    if ((psVar8 != (sat_solver *)0x0) && (uVar7 = 0, 0 < psVar8->size)) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        if (psVar8->pFreqs[lVar6] != '\0') {
          psVar8->pFreqs[lVar6] = '\0';
          uVar7 = (ulong)((int)uVar7 + 1);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < psVar8->size);
    }
    psVar8 = p->pSat;
    if (psVar8 != (sat_solver *)0x0) {
      uVar9 = (ulong)(uint)psVar8->nLearntStart;
    }
    uVar10 = 0;
    uVar11 = 0;
    if (psVar8 == (sat_solver *)0x0) {
      local_3c = 0;
      if (p->pSat3 == (bmcg_sat_solver *)0x0) {
        uVar4 = satoko_varnum(p->pSat2);
      }
      else {
        uVar4 = bmcg_sat_solver_varnum(p->pSat3);
      }
    }
    else {
      uVar11 = (ulong)(uint)psVar8->nLearntDelta;
      uVar10 = psVar8->nLearntRatio;
      local_3c = psVar8->nDBreduces;
      uVar4 = sat_solver_nvars(psVar8);
    }
    psVar8 = p->pSat;
    if (psVar8 == (sat_solver *)0x0) {
      s = p->pSat3;
      if (s == (bmcg_sat_solver *)0x0) {
        s_00 = p->pSat2;
        iVar5 = satoko_varnum(s_00);
        level = (int)s_00;
      }
      else {
        iVar5 = bmcg_sat_solver_varnum(s);
        level = (int)s;
      }
    }
    else {
      iVar5 = sat_solver_nvars(psVar8);
      level = (int)psVar8;
    }
    Abc_Print(level,
              "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n"
              ,((double)(int)uVar7 * 100.0) / (double)iVar5,uVar9,uVar11,(ulong)uVar10,
              (ulong)local_3c,(ulong)uVar4,uVar7);
    Abc_Print(p->nUniProps,
              "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n",
              (ulong)(uint)p->nBufNum,(ulong)(uint)p->nDupNum,(ulong)(uint)p->nHashHit,
              (ulong)(uint)p->nHashMiss,(ulong)(uint)p->nUniProps);
  }
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    if (p->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x332,"void Saig_Bmc3ManStop(Gia_ManBmc_t *)");
    }
    p->pAig->vSeqModelVec = p->vCexes;
    p->vCexes = (Vec_Ptr_t *)0x0;
  }
  __ptr = p->vVisited;
  if (0 < __ptr->nCap) {
    lVar12 = 8;
    lVar6 = 0;
    do {
      pvVar1 = *(void **)((long)&__ptr->pArray->nCap + lVar12);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)&__ptr->pArray->nCap + lVar12) = 0;
      }
      lVar6 = lVar6 + 1;
      lVar12 = lVar12 + 0x10;
    } while (lVar6 < __ptr->nCap);
  }
  if (__ptr->pArray != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (Vec_Int_t *)0x0;
  }
  __ptr->nCap = 0;
  __ptr->nSize = 0;
  free(__ptr);
  pVVar2 = p->vMapping;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vMapRefs;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vId2Num;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar3 = p->vId2Var;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar6];
      if (pvVar1 != (void *)0x0) {
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        free(pvVar1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar3->nSize);
  }
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (void **)0x0;
  }
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vTerInfo;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar3->nSize) {
      lVar6 = 0;
      do {
        if ((void *)0x2 < pVVar3->pArray[lVar6]) {
          free(pVVar3->pArray[lVar6]);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar3->nSize);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      pVVar3->pArray = (void **)0x0;
    }
    free(pVVar3);
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p->pSat2 != (solver_t *)0x0) {
    satoko_destroy(p->pSat2);
  }
  if (p->pSat3 != (bmcg_sat_solver *)0x0) {
    bmcg_sat_solver_stop(p->pSat3);
  }
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  pVVar2 = p->vData;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  __ptr_00 = p->vHash;
  pVVar2 = __ptr_00->vTable;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  __ptr_01 = __ptr_00->vObjs;
  if (__ptr_01->pArray != (word *)0x0) {
    free(__ptr_01->pArray);
    __ptr_01->pArray = (word *)0x0;
  }
  if (__ptr_01 != (Vec_Wrd_t *)0x0) {
    free(__ptr_01);
  }
  if (__ptr_00 != (Hsh_IntMan_t *)0x0) {
    free(__ptr_00);
  }
  pVVar2 = p->vId2Lit;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  if (p->pSops[1] != (char *)0x0) {
    free(p->pSops[1]);
    p->pSops[1] = (char *)0x0;
  }
  if (p->pSops != (char **)0x0) {
    free(p->pSops);
    p->pSops = (char **)0x0;
  }
  free(p);
  return;
}

Assistant:

void Saig_Bmc3ManStop( Gia_ManBmc_t * p )
{
    if ( p->pPars->fVerbose )
    {
        int nUsedVars = p->pSat ? sat_solver_count_usedvars(p->pSat) : 0;
        Abc_Print( 1, "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n", 
            p->pSat ? p->pSat->nLearntStart     : 0, 
            p->pSat ? p->pSat->nLearntDelta     : 0, 
            p->pSat ? p->pSat->nLearntRatio     : 0, 
            p->pSat ? p->pSat->nDBreduces       : 0, 
            p->pSat ? sat_solver_nvars(p->pSat) : p->pSat3 ? bmcg_sat_solver_varnum(p->pSat3) : satoko_varnum(p->pSat2), 
            nUsedVars, 
            100.0*nUsedVars/(p->pSat ? sat_solver_nvars(p->pSat) : p->pSat3 ? bmcg_sat_solver_varnum(p->pSat3) : satoko_varnum(p->pSat2)) );
        Abc_Print( 1, "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n", 
            p->nBufNum, p->nDupNum, p->nHashHit, p->nHashMiss, p->nUniProps );
    }
//    Aig_ManCleanMarkA( p->pAig );
    if ( p->vCexes )
    {
        assert( p->pAig->vSeqModelVec == NULL );
        p->pAig->vSeqModelVec = p->vCexes;
        p->vCexes = NULL;
    }
//    Vec_PtrFreeFree( p->vCexes );
    Vec_WecFree( p->vVisited );
    Vec_IntFree( p->vMapping );
    Vec_IntFree( p->vMapRefs );
//    Vec_VecFree( p->vSects );
    Vec_IntFree( p->vId2Num );
    Vec_VecFree( (Vec_Vec_t *)p->vId2Var );
    Vec_PtrFreeFree( p->vTerInfo );
    if ( p->pSat )  sat_solver_delete( p->pSat );
    if ( p->pSat2 ) satoko_destroy( p->pSat2 );
    if ( p->pSat3 ) bmcg_sat_solver_stop( p->pSat3 );
    ABC_FREE( p->pTime4Outs );
    Vec_IntFree( p->vData );
    Hsh_IntManStop( p->vHash );
    Vec_IntFree( p->vId2Lit );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}